

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O0

void If_ManImproveNodeFaninUpdate(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited)

{
  int iVar1;
  If_Obj_t *pIVar2;
  If_Obj_t *pFanin;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vFront_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  iVar1 = If_ObjIsAnd(pObj);
  if (iVar1 != 0) {
    Vec_PtrRemove(vFront,pObj);
    pIVar2 = If_ObjFanin0(pObj);
    if ((*(uint *)pIVar2 >> 8 & 1) == 0) {
      Vec_PtrPush(vFront,pIVar2);
      Vec_PtrPush(vVisited,pIVar2);
      *(uint *)pIVar2 = *(uint *)pIVar2 & 0xfffffeff | 0x100;
    }
    pIVar2 = If_ObjFanin1(pObj);
    if ((*(uint *)pIVar2 >> 8 & 1) == 0) {
      Vec_PtrPush(vFront,pIVar2);
      Vec_PtrPush(vVisited,pIVar2);
      *(uint *)pIVar2 = *(uint *)pIVar2 & 0xfffffeff | 0x100;
    }
    return;
  }
  __assert_fail("If_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifReduce.c"
                ,0x13c,
                "void If_ManImproveNodeFaninUpdate(If_Man_t *, If_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

void If_ManImproveNodeFaninUpdate( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited )
{
    If_Obj_t * pFanin;
    assert( If_ObjIsAnd(pObj) );
    Vec_PtrRemove( vFront, pObj );
    pFanin = If_ObjFanin0(pObj);
    if ( !pFanin->fMark )
    {
        Vec_PtrPush( vFront, pFanin );
        Vec_PtrPush( vVisited, pFanin );
        pFanin->fMark = 1;
    }
    pFanin = If_ObjFanin1(pObj);
    if ( !pFanin->fMark )
    {
        Vec_PtrPush( vFront, pFanin );
        Vec_PtrPush( vVisited, pFanin );
        pFanin->fMark = 1;
    }
}